

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_3::generateRandomInputData
               (Random *rnd,ShaderType shaderType,DataType dataType,Precision precision,
               deUint32 *dst,int numValues)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  int local_4c;
  int local_48;
  int compNdx_1;
  int valueNdx_1;
  int compNdx;
  int valueNdx;
  bool isUnsigned;
  deUint32 integerMask;
  deUint32 integerLength;
  int scalarSize;
  int numValues_local;
  deUint32 *dst_local;
  Precision precision_local;
  DataType dataType_local;
  ShaderType shaderType_local;
  Random *rnd_local;
  
  iVar2 = glu::getDataTypeScalarSize(dataType);
  dVar3 = getShaderUintBitCount(shaderType,precision);
  dVar4 = getLowBitMask(dVar3);
  bVar1 = glu::isDataTypeUintOrUVec(dataType);
  if (bVar1) {
    for (valueNdx_1 = 0; valueNdx_1 < numValues; valueNdx_1 = valueNdx_1 + 1) {
      for (compNdx_1 = 0; compNdx_1 < iVar2; compNdx_1 = compNdx_1 + 1) {
        dVar3 = de::Random::getUint32(rnd);
        dst[valueNdx_1 * iVar2 + compNdx_1] = dVar3 & dVar4;
      }
    }
  }
  else {
    for (local_48 = 0; local_48 < numValues; local_48 = local_48 + 1) {
      for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
        dVar5 = de::Random::getUint32(rnd);
        dVar5 = extendSignTo32(dVar5 & dVar4,dVar3);
        dst[local_48 * iVar2 + local_4c] = dVar5;
      }
    }
  }
  return;
}

Assistant:

static void generateRandomInputData (de::Random& rnd, glu::ShaderType shaderType, glu::DataType dataType, glu::Precision precision, deUint32* dst, int numValues)
{
	const int				scalarSize		= glu::getDataTypeScalarSize(dataType);
	const deUint32			integerLength	= (deUint32)getShaderUintBitCount(shaderType, precision);
	const deUint32			integerMask		= getLowBitMask(integerLength);
	const bool				isUnsigned		= glu::isDataTypeUintOrUVec(dataType);

	if (isUnsigned)
	{
		for (int valueNdx = 0; valueNdx < numValues; ++valueNdx)
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				dst[valueNdx*scalarSize + compNdx] = rnd.getUint32() & integerMask;
	}
	else
	{
		for (int valueNdx = 0; valueNdx < numValues; ++valueNdx)
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				dst[valueNdx*scalarSize + compNdx] = extendSignTo32(rnd.getUint32() & integerMask, integerLength);
	}
}